

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O0

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset)

{
  value_type vVar1;
  pointer piVar2;
  int new_num_strips;
  int iVar3;
  int iVar4;
  size_t __n;
  int *piVar5;
  reference pvVar6;
  int *p_00;
  bool bVar7;
  size_type local_c0;
  size_t j_1;
  int *pp_1;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> dad_1;
  int *p_1;
  int i_1;
  size_type sStack_78;
  int current;
  size_t j;
  int *pp;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> dad;
  int *p;
  int i;
  int level0_offset;
  int max_parents;
  int num_points;
  size_t num_dimensions;
  MultiIndexSet *mset_local;
  Data2D<int> *parents;
  
  __n = MultiIndexSet::getNumDimensions(mset);
  new_num_strips = MultiIndexSet::getNumIndexes(mset);
  iVar3 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)4>();
  max_parents = (int)__n;
  if (iVar3 < 2) {
    Data2D<int>::Data2D<int,int>(__return_storage_ptr__,max_parents,new_num_strips);
    for (p_1._4_4_ = 0; p_1._4_4_ < new_num_strips; p_1._4_4_ = p_1._4_4_ + 1) {
      dad_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = MultiIndexSet::getIndex(mset,p_1._4_4_);
      ::std::allocator<int>::allocator((allocator<int> *)((long)&pp_1 + 7));
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_a8,__n,
                 (allocator<int> *)((long)&pp_1 + 7));
      ::std::allocator<int>::~allocator((allocator<int> *)((long)&pp_1 + 7));
      piVar2 = dad_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar5 = ::std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_a8);
      ::std::copy_n<int_const*,unsigned_long,int*>(piVar2,__n,piVar5);
      piVar5 = Data2D<int>::getStrip(__return_storage_ptr__,p_1._4_4_);
      for (local_c0 = 0; local_c0 < __n; local_c0 = local_c0 + 1) {
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
        if (*pvVar6 == 0) {
          piVar5[local_c0] = -1;
        }
        else {
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
          iVar3 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)4>(*pvVar6);
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
          *pvVar6 = iVar3;
          p_00 = ::std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)local_a8);
          iVar3 = MultiIndexSet::getSlot(mset,p_00);
          piVar5[local_c0] = iVar3;
          while( true ) {
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
            bVar7 = false;
            if (*pvVar6 != 0) {
              bVar7 = piVar5[local_c0] == -1;
            }
            if (!bVar7) break;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
            iVar3 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)4>(*pvVar6);
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
            *pvVar6 = iVar3;
            iVar3 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_a8);
            piVar5[local_c0] = iVar3;
          }
          vVar1 = dad_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[local_c0];
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_a8,local_c0);
          *pvVar6 = vVar1;
        }
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_a8);
    }
  }
  else {
    iVar3 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)4>();
    Data2D<int>::Data2D<int,int>(__return_storage_ptr__,iVar3 * max_parents,new_num_strips,-1);
    iVar3 = RuleLocal::getNumPoints<(TasGrid::RuleLocal::erule)4>(0);
    for (p._0_4_ = 0; (int)p < new_num_strips; p._0_4_ = (int)p + 1) {
      dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = MultiIndexSet::getIndex(mset,(int)p);
      ::std::allocator<int>::allocator((allocator<int> *)((long)&pp + 7));
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_60,__n,(allocator<int> *)((long)&pp + 7)
                );
      ::std::allocator<int>::~allocator((allocator<int> *)((long)&pp + 7));
      piVar2 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar5 = ::std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_60);
      ::std::copy_n<int_const*,unsigned_long,int*>(piVar2,__n,piVar5);
      piVar5 = Data2D<int>::getStrip(__return_storage_ptr__,(int)p);
      for (sStack_78 = 0; sStack_78 < __n; sStack_78 = sStack_78 + 1) {
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
        if (iVar3 <= *pvVar6) {
          i_1 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage[sStack_78];
          iVar4 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)4>(i_1);
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
          *pvVar6 = iVar4;
          iVar4 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_60);
          piVar5[sStack_78 * 2] = iVar4;
          while( true ) {
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
            bVar7 = false;
            if (iVar3 <= *pvVar6) {
              bVar7 = piVar5[sStack_78 * 2] == -1;
            }
            if (!bVar7) break;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
            i_1 = *pvVar6;
            iVar4 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)4>(i_1);
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
            *pvVar6 = iVar4;
            iVar4 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_60);
            piVar5[sStack_78 * 2] = iVar4;
          }
          iVar4 = RuleLocal::getStepParent<(TasGrid::RuleLocal::erule)4>(i_1);
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
          *pvVar6 = iVar4;
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
          if (*pvVar6 != -1) {
            iVar4 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_60);
            piVar5[sStack_78 * 2 + 1] = iVar4;
          }
          vVar1 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage[sStack_78];
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,sStack_78);
          *pvVar6 = vVar1;
        }
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] >= level0_offset){
                    int current = p[j];
                    dad[j] = RuleLocal::getParent<effrule>(current);
                    pp[2*j] = mset.getSlot(dad);
                    while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                        current = dad[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                    }
                    dad[j] = RuleLocal::getStepParent<effrule>(current);
                    if (dad[j] != -1){
                        pp[2*j + 1] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] == 0){
                    pp[j] = -1;
                }else{
                    dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                    pp[j] = mset.getSlot(dad.data());
                    while((dad[j] != 0) && (pp[j] == -1)){
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }
}